

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void __thiscall cmVariableWatchCommand::~cmVariableWatchCommand(cmVariableWatchCommand *this)

{
  ~cmVariableWatchCommand(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

cmVariableWatchCommand::~cmVariableWatchCommand()
{
  for (std::string const& wv : this->WatchedVariables) {
    this->Makefile->GetCMakeInstance()->GetVariableWatch()->RemoveWatch(
      wv, cmVariableWatchCommandVariableAccessed);
  }
}